

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O0

void __thiscall xray_re::xr_partition::xr_partition(xr_partition *this,xr_bone_vec *bones)

{
  bool bVar1;
  size_type __n;
  reference ppxVar2;
  string *__x;
  __normal_iterator<xray_re::xr_bone_*const_*,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
  local_40;
  xr_bone_vec_cit end;
  xr_bone_vec_cit it;
  allocator<char> local_19;
  xr_bone_vec *local_18;
  xr_bone_vec *bones_local;
  xr_partition *this_local;
  
  this->_vptr_xr_partition = (_func_int **)&PTR__xr_partition_0038e460;
  this->m_id = 0;
  local_18 = bones;
  bones_local = (xr_bone_vec *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_name,"default",&local_19);
  std::allocator<char>::~allocator(&local_19);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_bones);
  __n = std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::size(local_18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->m_bones,__n);
  end._M_current =
       (xr_bone **)
       std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::begin(local_18);
  local_40._M_current =
       (xr_bone **)
       std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::end(local_18);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_40);
    if (!bVar1) break;
    ppxVar2 = __gnu_cxx::
              __normal_iterator<xray_re::xr_bone_*const_*,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
              ::operator*(&end);
    __x = xr_bone::name_abi_cxx11_(*ppxVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_bones,__x);
    __gnu_cxx::
    __normal_iterator<xray_re::xr_bone_*const_*,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
    ::operator++(&end);
  }
  return;
}

Assistant:

xr_partition::xr_partition(const xr_bone_vec& bones): m_id(0), m_name("default")
{
	m_bones.reserve(bones.size());
	for (xr_bone_vec_cit it = bones.begin(), end = bones.end(); it != end; ++it)
		m_bones.push_back((*it)->name());
}